

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.c
# Opt level: O0

void bits_bitmap2items(char *bitmap,lysc_type_bits *type,lysc_type_bitenum_item **items)

{
  lysc_type_bitenum_item *plVar1;
  size_t sVar2;
  long local_58;
  uint8_t *byte;
  uint8_t bitmask;
  uint32_t bit_pos;
  size_t bitmap_size;
  size_t i;
  lysc_type_bitenum_item **items_local;
  lysc_type_bits *type_local;
  char *bitmap_local;
  
  sVar2 = lyplg_type_bits_bitmap_size(type);
  byte._4_4_ = 0;
  bitmap_size = 0;
  do {
    if (sVar2 <= bitmap_size) {
      return;
    }
    for (byte._3_1_ = 1; byte._3_1_ != 0; byte._3_1_ = byte._3_1_ << 1) {
      if ((bitmap[bitmap_size] & byte._3_1_) != 0) {
        bits_add_item(byte._4_4_,type,items);
      }
      if (type->bits == (lysc_type_bitenum_item *)0x0) {
        local_58 = 0;
      }
      else {
        plVar1 = type->bits;
        local_58._0_4_ = plVar1[-1].field_4;
        local_58._4_2_ = plVar1[-1].flags;
        local_58._6_2_ = *(undefined2 *)&plVar1[-1].field_0x26;
      }
      if (byte._4_4_ == type->bits[local_58 + -1].field_4.value) break;
      byte._4_4_ = byte._4_4_ + 1;
    }
    bitmap_size = bitmap_size + 1;
  } while( true );
}

Assistant:

static void
bits_bitmap2items(const char *bitmap, struct lysc_type_bits *type, struct lysc_type_bitenum_item **items)
{
    size_t i, bitmap_size = lyplg_type_bits_bitmap_size(type);
    uint32_t bit_pos;
    uint8_t bitmask;
    const uint8_t *byte;

    bit_pos = 0;
    for (i = 0; i < bitmap_size; ++i) {
        /* check this byte (but not necessarily all bits in the last byte) */
        byte = (uint8_t *)BITS_BITMAP_BYTE(bitmap, bitmap_size, i);
        for (bitmask = 1; bitmask; bitmask <<= 1) {
            if (*byte & bitmask) {
                /* add this bit */
                bits_add_item(bit_pos, type, items);
            }

            if (bit_pos == BITS_LAST_BIT_POSITION(type)) {
                /* we have checked the last valid bit */
                break;
            }

            ++bit_pos;
        }
    }
}